

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::replace_extension(SmallVectorImpl<char> *path,Twine *extension,Style style)

{
  char cVar1;
  size_t N;
  size_t sVar2;
  Style style_00;
  size_t sVar4;
  StringRef str;
  undefined1 local_80 [8];
  SmallString<32U> ext_storage;
  StringRef p;
  StringRef ext;
  uint *puVar3;
  
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       (path->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>
       .super_SmallVectorBase.BeginX;
  p.Data = (char *)(ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  puVar3 = &ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size;
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  local_80 = (undefined1  [8])puVar3;
  join_0x00000010_0x00000000_ = Twine::toStringRef(extension,(SmallVectorImpl<char> *)local_80);
  style_00 = (Style)puVar3;
  sVar4 = p._16_8_;
  N = StringRef::rfind((StringRef *)
                       (ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>
                        .InlineElts + 0x18),'.',0xffffffffffffffff);
  if (N != 0xffffffffffffffff) {
    str.Length._0_4_ = style;
    str.Data = p.Data;
    str.Length._4_4_ = 0;
    sVar2 = anon_unknown.dwarf_2fc435f::filename_pos
                      ((anon_unknown_dwarf_2fc435f *)
                       ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                       InlineElts._24_8_,str,style_00);
    if (sVar2 <= N) {
      SmallVectorBase::set_size((SmallVectorBase *)path,N);
    }
  }
  if (sVar4 != 0) {
    cVar1 = StringRef::operator[]((StringRef *)&p.Length,0);
    if (cVar1 != '.') {
      ext.Length._7_1_ = 0x2e;
      SmallVectorTemplateBase<char,_true>::push_back
                (&path->super_SmallVectorTemplateBase<char,_true>,(char *)((long)&ext.Length + 7));
    }
  }
  SmallVectorImpl<char>::append<char_const*,void>(path,(char *)p.Length,ext.Data + p.Length);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)local_80);
  return;
}

Assistant:

void replace_extension(SmallVectorImpl<char> &path, const Twine &extension,
                       Style style) {
  StringRef p(path.begin(), path.size());
  SmallString<32> ext_storage;
  StringRef ext = extension.toStringRef(ext_storage);

  // Erase existing extension.
  size_t pos = p.find_last_of('.');
  if (pos != StringRef::npos && pos >= filename_pos(p, style))
    path.set_size(pos);

  // Append '.' if needed.
  if (ext.size() > 0 && ext[0] != '.')
    path.push_back('.');

  // Append extension.
  path.append(ext.begin(), ext.end());
}